

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

void __thiscall PacketBuilder::~PacketBuilder(PacketBuilder *this)

{
  size_t __n;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  __n = (this->data)._M_string_length;
  if (__n != 0) {
    memset((this->data)._M_dataplus._M_p,0,__n);
  }
  pcVar1 = (this->data)._M_dataplus._M_p;
  paVar2 = &(this->data).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

PacketBuilder::~PacketBuilder()
{
	std::fill(UTIL_RANGE(this->data), '\0');
}